

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_interface.cpp
# Opt level: O0

void UI::execute_simple_append_interactive
               (string *first_geo,string *second_geo,string *output_geo,string *char_len)

{
  string local_b8;
  string local_98;
  string local_68;
  string local_48;
  string *local_28;
  string *char_len_local;
  string *output_geo_local;
  string *second_geo_local;
  string *first_geo_local;
  
  local_28 = char_len;
  char_len_local = output_geo;
  output_geo_local = second_geo;
  second_geo_local = first_geo;
  std::__cxx11::string::string((string *)&local_48,(string *)first_geo);
  std::__cxx11::string::string((string *)&local_68,(string *)second_geo);
  std::__cxx11::string::string((string *)&local_98,(string *)output_geo);
  std::__cxx11::string::string((string *)&local_b8,(string *)char_len);
  simple_append(&local_48,&local_68,&local_98,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void UI::execute_simple_append_interactive( std::string first_geo,
                                            std::string second_geo,
                                            std::string output_geo,
                                            std::string char_len)
{
    simple_append(first_geo, second_geo, output_geo, char_len);
}